

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O3

void __thiscall btSoftBody::initDefaults(btSoftBody *this)

{
  btMatrix3x3 *pbVar1;
  btTransform *pbVar2;
  btVector3 *pbVar3;
  btCollisionShape *this_00;
  
  (this->super_btCollisionObject).m_internalType = 8;
  (this->m_cfg).aeromodel = V_Point;
  (this->m_cfg).kVCF = 1.0;
  (this->m_cfg).kDP = 0.0;
  (this->m_cfg).kDG = 0.0;
  (this->m_cfg).kLF = 0.0;
  (this->m_cfg).kPR = 0.0;
  (this->m_cfg).kVC = 0.0;
  (this->m_cfg).kDF = 0.2;
  (this->m_cfg).kMT = 0.0;
  (this->m_cfg).kCHR = 1.0;
  (this->m_cfg).kKHR = 0.1;
  (this->m_cfg).kSHR = 1.0;
  (this->m_cfg).kAHR = 0.7;
  (this->m_cfg).kSRHR_CL = 0.1;
  (this->m_cfg).kSKHR_CL = 1.0;
  (this->m_cfg).kSSHR_CL = 0.5;
  (this->m_cfg).kSR_SPLT_CL = 0.5;
  (this->m_cfg).kSK_SPLT_CL = 0.5;
  (this->m_cfg).kSS_SPLT_CL = 0.5;
  (this->m_cfg).maxvolume = 1.0;
  (this->m_cfg).timescale = 1.0;
  (this->m_cfg).viterations = 0;
  (this->m_cfg).piterations = 1;
  (this->m_cfg).diterations = 0;
  (this->m_cfg).citerations = 4;
  (this->m_cfg).collisions = 1;
  (this->m_pose).m_bvolume = false;
  (this->m_pose).m_bframe = false;
  (this->m_pose).m_volume = 0.0;
  (this->m_pose).m_com.m_floats[0] = 0.0;
  (this->m_pose).m_com.m_floats[1] = 0.0;
  (this->m_pose).m_com.m_floats[2] = 0.0;
  (this->m_pose).m_com.m_floats[3] = 0.0;
  (this->m_pose).m_rot.m_el[0].m_floats[0] = 1.0;
  pbVar1 = &(this->m_pose).m_rot;
  pbVar1->m_el[0].m_floats[1] = 0.0;
  pbVar1->m_el[0].m_floats[2] = 0.0;
  *(undefined8 *)((this->m_pose).m_rot.m_el[0].m_floats + 3) = 0;
  (this->m_pose).m_rot.m_el[1].m_floats[1] = 1.0;
  pbVar3 = (this->m_pose).m_rot.m_el;
  pbVar3[1].m_floats[2] = 0.0;
  pbVar3[1].m_floats[3] = 0.0;
  pbVar1 = &(this->m_pose).m_rot;
  pbVar1->m_el[2].m_floats[0] = 0.0;
  pbVar1->m_el[2].m_floats[1] = 0.0;
  pbVar3 = (this->m_pose).m_rot.m_el;
  pbVar3[2].m_floats[2] = 1.0;
  pbVar3[2].m_floats[3] = 0.0;
  (this->m_pose).m_scl.m_el[0].m_floats[0] = 1.0;
  pbVar1 = &(this->m_pose).m_scl;
  pbVar1->m_el[0].m_floats[1] = 0.0;
  pbVar1->m_el[0].m_floats[2] = 0.0;
  *(undefined8 *)((this->m_pose).m_scl.m_el[0].m_floats + 3) = 0;
  (this->m_pose).m_scl.m_el[1].m_floats[1] = 1.0;
  pbVar3 = (this->m_pose).m_scl.m_el;
  pbVar3[1].m_floats[2] = 0.0;
  pbVar3[1].m_floats[3] = 0.0;
  pbVar1 = &(this->m_pose).m_scl;
  pbVar1->m_el[2].m_floats[0] = 0.0;
  pbVar1->m_el[2].m_floats[1] = 0.0;
  pbVar3 = (this->m_pose).m_scl.m_el;
  pbVar3[2].m_floats[2] = 1.0;
  pbVar3[2].m_floats[3] = 0.0;
  this->m_tag = (void *)0x0;
  this->m_timeacc = 0.0;
  this->m_bUpdateRtCst = true;
  this->m_bounds[1].m_floats[0] = 0.0;
  this->m_bounds[1].m_floats[1] = 0.0;
  this->m_bounds[1].m_floats[2] = 0.0;
  this->m_bounds[1].m_floats[3] = 0.0;
  this->m_bounds[0].m_floats[0] = 0.0;
  this->m_bounds[0].m_floats[1] = 0.0;
  this->m_bounds[0].m_floats[2] = 0.0;
  this->m_bounds[0].m_floats[3] = 0.0;
  (this->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0] = 1.0;
  pbVar1 = &(this->super_btCollisionObject).m_worldTransform.m_basis;
  pbVar1->m_el[0].m_floats[1] = 0.0;
  pbVar1->m_el[0].m_floats[2] = 0.0;
  *(undefined8 *)((this->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats + 3) = 0
  ;
  (this->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1] = 1.0;
  pbVar3 = (this->super_btCollisionObject).m_worldTransform.m_basis.m_el;
  pbVar3[1].m_floats[2] = 0.0;
  pbVar3[1].m_floats[3] = 0.0;
  pbVar1 = &(this->super_btCollisionObject).m_worldTransform.m_basis;
  pbVar1->m_el[2].m_floats[0] = 0.0;
  pbVar1->m_el[2].m_floats[1] = 0.0;
  (this->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2] = 1.0;
  *(undefined8 *)((this->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats + 3) = 0
  ;
  pbVar2 = &(this->super_btCollisionObject).m_worldTransform;
  (pbVar2->m_origin).m_floats[1] = 0.0;
  (pbVar2->m_origin).m_floats[2] = 0.0;
  (this->super_btCollisionObject).m_worldTransform.m_origin.m_floats[3] = 0.0;
  setSolver(this,Default);
  this_00 = (btCollisionShape *)btAlignedAllocInternal(0x28,0x10);
  btConcaveShape::btConcaveShape((btConcaveShape *)this_00);
  ((btCollisionShape *)&this_00->_vptr_btCollisionShape)->_vptr_btCollisionShape =
       (_func_int **)&PTR__btConcaveShape_00221548;
  this_00->m_shapeType = 0x20;
  ((btCollisionShape *)&this_00[1]._vptr_btCollisionShape)->_vptr_btCollisionShape =
       (_func_int **)this;
  (this->super_btCollisionObject).m_collisionShape = this_00;
  *(undefined4 *)&this_00->field_0x1c = 0x3e800000;
  (this->m_initialWorldTransform).m_basis.m_el[0].m_floats[0] = 1.0;
  pbVar1 = &(this->m_initialWorldTransform).m_basis;
  pbVar1->m_el[0].m_floats[1] = 0.0;
  pbVar1->m_el[0].m_floats[2] = 0.0;
  *(undefined8 *)((this->m_initialWorldTransform).m_basis.m_el[0].m_floats + 3) = 0;
  (this->m_initialWorldTransform).m_basis.m_el[1].m_floats[1] = 1.0;
  pbVar3 = (this->m_initialWorldTransform).m_basis.m_el;
  pbVar3[1].m_floats[2] = 0.0;
  pbVar3[1].m_floats[3] = 0.0;
  pbVar1 = &(this->m_initialWorldTransform).m_basis;
  pbVar1->m_el[2].m_floats[0] = 0.0;
  pbVar1->m_el[2].m_floats[1] = 0.0;
  (this->m_initialWorldTransform).m_basis.m_el[2].m_floats[2] = 1.0;
  *(undefined8 *)((this->m_initialWorldTransform).m_basis.m_el[2].m_floats + 3) = 0;
  (this->m_initialWorldTransform).m_origin.m_floats[1] = 0.0;
  (this->m_initialWorldTransform).m_origin.m_floats[2] = 0.0;
  *(undefined8 *)((this->m_initialWorldTransform).m_origin.m_floats + 3) = 0;
  (this->m_windVelocity).m_floats[1] = 0.0;
  (this->m_windVelocity).m_floats[2] = 0.0;
  *(undefined8 *)((this->m_windVelocity).m_floats + 3) = 0x3f80000000000000;
  return;
}

Assistant:

void	btSoftBody::initDefaults()
{
	m_internalType		=	CO_SOFT_BODY;
	m_cfg.aeromodel		=	eAeroModel::V_Point;
	m_cfg.kVCF			=	1;
	m_cfg.kDG			=	0;
	m_cfg.kLF			=	0;
	m_cfg.kDP			=	0;
	m_cfg.kPR			=	0;
	m_cfg.kVC			=	0;
	m_cfg.kDF			=	(btScalar)0.2;
	m_cfg.kMT			=	0;
	m_cfg.kCHR			=	(btScalar)1.0;
	m_cfg.kKHR			=	(btScalar)0.1;
	m_cfg.kSHR			=	(btScalar)1.0;
	m_cfg.kAHR			=	(btScalar)0.7;
	m_cfg.kSRHR_CL		=	(btScalar)0.1;
	m_cfg.kSKHR_CL		=	(btScalar)1;
	m_cfg.kSSHR_CL		=	(btScalar)0.5;
	m_cfg.kSR_SPLT_CL	=	(btScalar)0.5;
	m_cfg.kSK_SPLT_CL	=	(btScalar)0.5;
	m_cfg.kSS_SPLT_CL	=	(btScalar)0.5;
	m_cfg.maxvolume		=	(btScalar)1;
	m_cfg.timescale		=	1;
	m_cfg.viterations	=	0;
	m_cfg.piterations	=	1;	
	m_cfg.diterations	=	0;
	m_cfg.citerations	=	4;
	m_cfg.collisions	=	fCollision::Default;
	m_pose.m_bvolume	=	false;
	m_pose.m_bframe		=	false;
	m_pose.m_volume		=	0;
	m_pose.m_com		=	btVector3(0,0,0);
	m_pose.m_rot.setIdentity();
	m_pose.m_scl.setIdentity();
	m_tag				=	0;
	m_timeacc			=	0;
	m_bUpdateRtCst		=	true;
	m_bounds[0]			=	btVector3(0,0,0);
	m_bounds[1]			=	btVector3(0,0,0);
	m_worldTransform.setIdentity();
	setSolver(eSolverPresets::Positions);
	
	/* Collision shape	*/ 
	///for now, create a collision shape internally
	m_collisionShape = new btSoftBodyCollisionShape(this);
	m_collisionShape->setMargin(0.25f);
	
	m_initialWorldTransform.setIdentity();

	m_windVelocity = btVector3(0,0,0);
	m_restLengthScale = btScalar(1.0);
}